

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pValue;
  char *zLeft;
  GenBlock *pGVar1;
  void *pvVar2;
  sxi32 sVar3;
  jx9_value *pjVar4;
  GenBlock **ppGVar5;
  jx9_vm *pVm;
  sxu32 nIdx;
  
  pValue = pGen->pIn;
  switch((pValue->sData).nByte) {
  case 4:
    zLeft = (pValue->sData).zString;
    sVar3 = SyStrnicmp(zLeft,"null",4);
    if (sVar3 == 0) {
LAB_00126481:
      pVm = pGen->pVm;
      sVar3 = 0;
      nIdx = 0;
      goto LAB_001264c5;
    }
    sVar3 = SyStrnicmp(zLeft,"true",4);
    if (sVar3 == 0) {
      pVm = pGen->pVm;
      nIdx = 1;
      goto LAB_001264c3;
    }
    break;
  case 5:
    sVar3 = SyStrnicmp((pValue->sData).zString,"false",5);
    if (sVar3 == 0) {
      pVm = pGen->pVm;
      nIdx = 2;
LAB_001264c3:
      sVar3 = 0;
      goto LAB_001264c5;
    }
    break;
  case 8:
    sVar3 = SyMemcmp((pValue->sData).zString,"__LINE__",8);
    if (sVar3 == 0) {
      pjVar4 = jx9VmReserveConstObj(pGen->pVm,&nIdx);
      if (pjVar4 == (jx9_value *)0x0) goto LAB_001264dc;
      jx9MemObjInitFromInt(pGen->pVm,pjVar4,(ulong)pValue->nLine);
LAB_001264b7:
      pVm = pGen->pVm;
      goto LAB_001264c3;
    }
    break;
  case 0xc:
    sVar3 = SyMemcmp((pValue->sData).zString,"__FUNCTION__",0xc);
    if (sVar3 == 0) {
      ppGVar5 = &pGen->pCurrent;
      while (pGVar1 = *ppGVar5, pGVar1 != (GenBlock *)0x0) {
        if ((pGVar1->iFlags & 8) != 0) {
          pvVar2 = pGVar1->pUserData;
          pjVar4 = jx9VmReserveConstObj(pGen->pVm,&nIdx);
          if (pjVar4 == (jx9_value *)0x0) goto LAB_001264dc;
          jx9MemObjInitFromString(pGen->pVm,pjVar4,(SyString *)((long)pvVar2 + 0x50));
          goto LAB_001264b7;
        }
        ppGVar5 = &pGVar1->pParent;
      }
      goto LAB_00126481;
    }
  }
  sVar3 = GenStateFindLiteral(pGen,&pValue->sData,&nIdx);
  if (sVar3 != 0) {
    pjVar4 = jx9VmReserveConstObj(pGen->pVm,&nIdx);
    if (pjVar4 == (jx9_value *)0x0) {
LAB_001264dc:
      GenStateOutOfMem(pGen);
      return -10;
    }
    jx9MemObjInitFromString(pGen->pVm,pjVar4,&pValue->sData);
    GenStateInstallLiteral(pGen,pjVar4,nIdx);
  }
  pVm = pGen->pVm;
  sVar3 = 1;
LAB_001264c5:
  jx9VmEmitInstr(pVm,4,sVar3,nIdx,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn;
	jx9_value *pObj;
	SyString *pStr;	
	sxu32 nIdx;
	/* Extract token value */
	pStr = &pToken->sData;
	/* Deal with the reserved literals [i.e: null, false, true, ...] first */
	if( pStr->nByte == sizeof("NULL") - 1 ){
		if( SyStrnicmp(pStr->zString, "null", sizeof("NULL")-1) == 0 ){
			/* NULL constant are always indexed at 0 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			return SXRET_OK;
		}else if( SyStrnicmp(pStr->zString, "true", sizeof("TRUE")-1) == 0 ){
			/* TRUE constant are always indexed at 1 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1, 0, 0);
			return SXRET_OK;
		}
	}else if (pStr->nByte == sizeof("FALSE") - 1 &&
		SyStrnicmp(pStr->zString, "false", sizeof("FALSE")-1) == 0 ){
			/* FALSE constant are always indexed at 2 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 2, 0, 0);
			return SXRET_OK;
	}else if(pStr->nByte == sizeof("__LINE__") - 1 &&
		SyMemcmp(pStr->zString, "__LINE__", sizeof("__LINE__")-1) == 0 ){
			/* TICKET 1433-004: __LINE__ constant must be resolved at compile time, not run time */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromInt(pGen->pVm, pObj, pToken->nLine);
			/* Emit the load constant instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			return SXRET_OK;
	}else if( pStr->nByte == sizeof("__FUNCTION__") - 1 &&
		SyMemcmp(pStr->zString, "__FUNCTION__", sizeof("__FUNCTION__")-1) == 0 ){
			GenBlock *pBlock = pGen->pCurrent;
			/* TICKET 1433-004: __FUNCTION__/__METHOD__ constants must be resolved at compile time, not run time */
			while( pBlock && (pBlock->iFlags & GEN_BLOCK_FUNC) == 0 ){
				/* Point to the upper block */
				pBlock = pBlock->pParent;
			}
			if( pBlock == 0 ){
				/* Called in the global scope, load NULL */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			}else{
				/* Extract the target function/method */
				jx9_vm_func *pFunc = (jx9_vm_func *)pBlock->pUserData;
				pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
				if( pObj == 0 ){
					return GenStateOutOfMem(pGen);
				}
				jx9MemObjInitFromString(pGen->pVm, pObj, &pFunc->sName);
				/* Emit the load constant instruction */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			}
			return SXRET_OK;
	}
	/* Query literal table */
	if( SXRET_OK != GenStateFindLiteral(&(*pGen), &pToken->sData, &nIdx) ){
		jx9_value *pObj;
		/* Unknown literal, install it in the literal table */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		GenStateInstallLiteral(&(*pGen), pObj, nIdx);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC,1,nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}